

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

long ixxx::posix::sysconf(int __name)

{
  int *piVar1;
  long lVar2;
  stat_error *this;
  
  piVar1 = __errno_location();
  *piVar1 = 0;
  lVar2 = ::sysconf(__name);
  if (lVar2 != -1) {
    return lVar2;
  }
  this = (stat_error *)__cxa_allocate_exception(0x20);
  stat_error::sys_error(this,*piVar1,(char *)0x0,ERRNO);
  __cxa_throw(this,&stat_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

long sysconf(int name)
    {
        errno = 0;
        long r = ::sysconf(name);
        if (r == -1)
            throw stat_error(errno);
        return r;
    }